

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

vector<short,_std::allocator<short>_> *
clickhouse::SliceVector<short>
          (vector<short,_std::allocator<short>_> *__return_storage_ptr__,
          vector<short,_std::allocator<short>_> *vec,size_t begin,size_t len)

{
  pointer psVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar1 = (vec->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = (long)(vec->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)psVar1 >> 1;
  uVar3 = uVar2 - begin;
  if (begin <= uVar2 && uVar3 != 0) {
    if (uVar3 < len) {
      len = uVar3;
    }
    psVar1 = psVar1 + begin;
    std::vector<short,std::allocator<short>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>>
              ((vector<short,std::allocator<short>> *)__return_storage_ptr__,psVar1,psVar1 + len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}